

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double cardioid_sample(double a,double b,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  dVar4 = cardioid_cdf_inv((double)iVar1 * 4.656612875e-10,a,b);
  return dVar4;
}

Assistant:

double cardioid_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CARDIOID_SAMPLE samples the Cardioid PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 July 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= B <= 0.5.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CARDIOD_SAMPLE, a sample of the PDF.
//    A - PI <= X <= A + PI.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = cardioid_cdf_inv ( cdf, a, b );

  return x;
}